

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusintegrator.cpp
# Opt level: O1

void huntAndUnregister(QList<QStringView> *pathComponents,int i,UnregisterMode mode,
                      ObjectTreeNode *node)

{
  long lVar1;
  QStringView *pQVar2;
  long lVar3;
  char cVar4;
  iterator iVar5;
  iterator iVar6;
  DataList *this;
  long lVar7;
  QStringView QVar8;
  QStringView QVar9;
  
  lVar7 = (long)i;
  if ((pathComponents->d).size == lVar7) {
    (node->field_2).obj = (QObject *)0x0;
    (node->flags).super_QFlagsStorageHelper<QDBusConnection::RegisterOption,_4>.
    super_QFlagsStorage<QDBusConnection::RegisterOption>.i = 0;
    if (mode == UnregisterTree) {
      QList<QDBusConnectionPrivate::ObjectTreeNode>::clear(&node->children);
      return;
    }
  }
  else {
    this = &node->children;
    iVar5 = QList<QDBusConnectionPrivate::ObjectTreeNode>::end(this);
    iVar6 = QList<QDBusConnectionPrivate::ObjectTreeNode>::begin(this);
    iVar6 = std::
            __lower_bound<QList<QDBusConnectionPrivate::ObjectTreeNode>::iterator,QStringView,__gnu_cxx::__ops::_Iter_less_val>
                      (iVar6.i,iVar5.i,(pathComponents->d).ptr + lVar7);
    if (iVar6.i != iVar5.i) {
      lVar1 = ((iVar6.i)->name).d.size;
      pQVar2 = (pathComponents->d).ptr;
      lVar3 = pQVar2[lVar7].m_size;
      if (lVar1 == lVar3) {
        QVar8.m_data = ((iVar6.i)->name).d.ptr;
        QVar8.m_size = lVar1;
        QVar9.m_data = pQVar2[lVar7].m_data;
        QVar9.m_size = lVar3;
        cVar4 = QtPrivate::equalStrings(QVar8,QVar9);
        if (cVar4 != '\0') {
          huntAndUnregister(pathComponents,i + 1,mode,iVar6.i);
          if ((((iVar6.i)->field_2).obj == (QObject *)0x0) && (((iVar6.i)->children).d.size == 0)) {
            QList<QDBusConnectionPrivate::ObjectTreeNode>::erase
                      (this,(const_iterator)iVar6.i,iVar6.i + 1);
            return;
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void huntAndUnregister(const QList<QStringView> &pathComponents, int i,
                              QDBusConnection::UnregisterMode mode,
                              QDBusConnectionPrivate::ObjectTreeNode *node)
{
    if (pathComponents.size() == i) {
        // found it
        node->obj = nullptr;
        node->flags = {};

        if (mode == QDBusConnection::UnregisterTree) {
            // clear the sub-tree as well
            node->children.clear();  // can't disconnect the objects because we really don't know if they can
                            // be found somewhere else in the path too
        }
    } else {
        // keep going
        QDBusConnectionPrivate::ObjectTreeNode::DataList::Iterator end = node->children.end();
        QDBusConnectionPrivate::ObjectTreeNode::DataList::Iterator it =
            std::lower_bound(node->children.begin(), end, pathComponents.at(i));
        if (it == end || it->name != pathComponents.at(i))
            return;              // node not found

        huntAndUnregister(pathComponents, i + 1, mode, &(*it));
        if (!it->isActive())
            node->children.erase(it);
    }
}